

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O2

void printBranchOperand(MCInst *MI,uint OpNo,SStream *O)

{
  _Bool _Var1;
  MCOperand *op;
  
  op = MCInst_getOperand(MI,OpNo);
  _Var1 = MCOperand_isImm(op);
  if (_Var1) {
    printAbsBranchOperand(MI,OpNo,O);
    return;
  }
  printOperand(MI,OpNo,O);
  return;
}

Assistant:

static void printBranchOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	if (!MCOperand_isImm(MCInst_getOperand(MI, OpNo))) {
		printOperand(MI, OpNo, O);
		return;
	}

	// Branches can take an immediate operand.  This is used by the branch
	// selection pass to print .+8, an eight byte displacement from the PC.
	printAbsBranchOperand(MI, OpNo, O);
}